

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool rw::readChunkHeaderInfo(Stream *s,ChunkHeaderInfo *header)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  undefined4 local_2c;
  undefined4 local_28;
  anon_struct_12_3_2a00130e buf;
  ChunkHeaderInfo *header_local;
  Stream *s_local;
  
  buf._4_8_ = header;
  Stream::read32(s,&local_2c,0xc);
  uVar1 = (*s->_vptr_Stream[7])();
  bVar3 = (uVar1 & 1) == 0;
  if (bVar3) {
    *(undefined4 *)buf._4_8_ = local_2c;
    *(undefined4 *)(buf._4_8_ + 4) = local_28;
    iVar2 = libraryIDUnpackVersion(buf.type);
    *(int *)(buf._4_8_ + 8) = iVar2;
    iVar2 = libraryIDUnpackBuild(buf.type);
    *(int *)(buf._4_8_ + 0xc) = iVar2;
  }
  return bVar3;
}

Assistant:

bool
readChunkHeaderInfo(Stream *s, ChunkHeaderInfo *header)
{
	struct {
		int32 type, size;
		uint32 id;
	} buf;
	s->read32(&buf, 12);
	if(s->eof())
		return false;
	assert(header != nil);
	header->type = buf.type;
	header->length = buf.size;
	header->version = libraryIDUnpackVersion(buf.id);
	header->build = libraryIDUnpackBuild(buf.id);
	return true;
}